

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

sexp_conflict
make_opcode_procedure(sexp_conflict ctx,sexp_conflict op,sexp_uint_t i,sexp_sint_t flags)

{
  sexp_conflict psVar1;
  sexp key;
  sexp ctx_00;
  sexp_uint_t sVar2;
  uint uVar3;
  sexp psVar4;
  sexp cell;
  sexp psVar5;
  char *message;
  uint uVar6;
  long lVar7;
  sexp_conflict ctx2;
  sexp_conflict refs;
  sexp_conflict params;
  sexp_conflict lambda;
  sexp_conflict res;
  sexp_conflict ref;
  sexp_conflict bc;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver6;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_f8;
  sexp local_f0;
  sexp local_e8;
  sexp local_e0;
  sexp local_d8;
  uint local_cc;
  sexp local_c8;
  sexp local_c0;
  sexp_uint_t local_b8;
  sexp_sint_t local_b0;
  sexp_gc_var_t local_a8;
  sexp_gc_var_t local_98;
  sexp_gc_var_t local_88;
  sexp_gc_var_t local_78;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  lVar7 = ((uint)flags & 1) + i;
  uVar6 = (uint)lVar7;
  local_c0 = (sexp)0x43e;
  local_a8.var = (sexp_conflict *)0x0;
  local_a8.next = (sexp_gc_var_t *)0x0;
  local_e8 = (sexp)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_c8 = (sexp)&DAT_0000043e;
  local_68.var = (sexp_conflict *)0x0;
  local_68.next = (sexp_gc_var_t *)0x0;
  local_f0 = (sexp)&DAT_0000043e;
  local_78.var = (sexp_conflict *)0x0;
  local_78.next = (sexp_gc_var_t *)0x0;
  local_e0 = (sexp)0x43e;
  local_88.var = (sexp_conflict *)0x0;
  local_88.next = (sexp_gc_var_t *)0x0;
  local_f8 = (sexp)0x43e;
  local_98.var = (sexp_conflict *)0x0;
  local_98.next = (sexp_gc_var_t *)0x0;
  uVar3 = (uint)(op->value).opcode.num_args;
  if (uVar6 == uVar3) {
    psVar1 = (op->value).type.getters;
    if (psVar1 != (sexp_conflict)0x0) {
      return psVar1;
    }
LAB_00120970:
    local_a8.var = &local_c0;
    local_58.next = &local_a8;
    local_a8.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_58.next;
    local_58.var = &local_e8;
    local_68.next = &local_58;
    (ctx->value).context.saves = local_68.next;
    local_68.var = &local_c8;
    local_78.next = &local_68;
    (ctx->value).context.saves = local_78.next;
    local_78.var = &local_f0;
    local_88.next = &local_78;
    (ctx->value).context.saves = local_88.next;
    local_88.var = &local_e0;
    local_98.next = &local_88;
    (ctx->value).context.saves = local_98.next;
    local_98.var = &local_f8;
    local_48.next = &local_98;
    (ctx->value).context.saves = local_48.next;
    lVar7 = lVar7 << 0x20;
    local_48.var = &local_d8;
    (ctx->value).context.saves = &local_48;
    local_d8 = (sexp)&DAT_0000023e;
    local_b0 = flags;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 0x20;
      psVar4 = (sexp)(lVar7 * 2 + 1);
      do {
        local_d8 = sexp_cons_op(ctx,(sexp)0x0,2,psVar4,local_d8);
        psVar4 = (sexp)((long)&psVar4[-1].value + 0x60be);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    (ctx->value).context.saves = local_48.next;
    local_e8 = local_d8;
    local_e0 = sexp_make_lambda(ctx,local_d8);
    local_f8 = sexp_make_child_context(ctx,local_e0);
    psVar4 = sexp_extend_env(local_f8,(ctx->value).type.cpl,local_e8,local_e0);
    if ((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 0x13)) {
      (local_f8->value).type.cpl = psVar4;
      local_f0 = (sexp)&DAT_0000023e;
      local_cc = uVar6;
      local_b8 = i;
      for (psVar5 = local_e8; (ctx_00 = local_f8, ((ulong)psVar5 & 3) == 0 && (psVar5->tag == 6));
          psVar5 = (psVar5->value).type.cpl) {
        key = (psVar5->value).type.name;
        cell = sexp_env_cell(ctx,psVar4,key,0);
        local_c8 = sexp_make_ref(ctx_00,key,cell);
        if ((((ulong)local_c8 & 3) != 0) || (local_c8->tag != 0x13)) {
          sexp_push_op(local_f8,&local_f0,local_c8);
        }
      }
      if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
        local_f0 = sexp_reverse_op(local_f8,(sexp)0x0,1,local_f0);
      }
      psVar4 = sexp_cons_op(local_f8,(sexp)0x0,2,op,local_f0);
      sVar2 = local_b8;
      uVar3 = local_cc;
      if ((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 0x13)) {
        local_f0 = psVar4;
        generate_opcode_app(local_f8,psVar4);
        local_c0 = sexp_complete_bytecode(local_f8);
        (local_c0->value).flonum = (op->value).flonum;
        psVar4 = sexp_make_procedure_op
                           (local_f8,(sexp)0x0,4,(sexp)(local_b0 * 2 + 1),(sexp)(sVar2 * 2 + 1),
                            local_c0,(sexp)&DAT_0000043e);
        if (uVar3 == (op->value).opcode.num_args) {
          (op->value).type.getters = psVar4;
        }
      }
    }
    (ctx->value).context.saves = local_a8.next;
    return psVar4;
  }
  if ((int)uVar6 < (int)uVar3) {
    message = "not enough args for opcode";
  }
  else {
    if (((op->value).opcode.flags & 1) != 0) goto LAB_00120970;
    message = "too many args for opcode";
  }
  psVar4 = sexp_compile_error(ctx,message,op);
  return psVar4;
}

Assistant:

static sexp make_opcode_procedure (sexp ctx, sexp op, sexp_uint_t i, sexp_sint_t flags) {
  int j = i+(flags & SEXP_PROC_VARIADIC);
  sexp ls, res, env;
  sexp_gc_var6(bc, params, ref, refs, lambda, ctx2);
  if (j == sexp_opcode_num_args(op)) { /* return before preserving */
    if (sexp_opcode_proc(op)) return sexp_opcode_proc(op);
  } else if (j < sexp_opcode_num_args(op)) {
    return sexp_compile_error(ctx, "not enough args for opcode", op);
  } else if (! sexp_opcode_variadic_p(op)) { /* i > num_args */
    return sexp_compile_error(ctx, "too many args for opcode", op);
  }
  sexp_gc_preserve6(ctx, bc, params, ref, refs, lambda, ctx2);
  params = make_param_list(ctx, j);
  lambda = sexp_make_lambda(ctx, params);
  ctx2 = sexp_make_child_context(ctx, lambda);
  env = sexp_extend_env(ctx2, sexp_context_env(ctx), params, lambda);
  if (sexp_exceptionp(env)) {
    res = env;
  } else {
    sexp_context_env(ctx2) = env;
    for (ls=params, refs=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls)) {
      ref = sexp_make_ref(ctx2, sexp_car(ls), sexp_env_cell(ctx, env, sexp_car(ls), 0));
      if (!sexp_exceptionp(ref)) sexp_push(ctx2, refs, ref);
    }
    if (!sexp_exceptionp(refs))
      refs = sexp_reverse(ctx2, refs);
    refs = sexp_cons(ctx2, op, refs);
    if (sexp_exceptionp(refs)) {
      res = refs;
    } else {
      generate_opcode_app(ctx2, refs);
      bc = sexp_complete_bytecode(ctx2);
      sexp_bytecode_name(bc) = sexp_opcode_name(op);
      res=sexp_make_procedure(ctx2, sexp_make_fixnum(flags), sexp_make_fixnum(i), bc, SEXP_VOID);
      if (j == sexp_opcode_num_args(op))
        sexp_opcode_proc(op) = res;
    }
  }
  sexp_gc_release6(ctx);
  return res;
}